

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::Schema> __thiscall capnp::compiler::Compiler::Node::getBootstrapSchema(Node *this)

{
  bool bVar1;
  Impl *pIVar2;
  Maybe<capnp::schema::Node::Reader> *pMVar3;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar4;
  Maybe<capnp::compiler::Compiler::Node::Content_&> MVar5;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar6;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  Node *in_RSI;
  Maybe<capnp::Schema> MVar7;
  
  if ((in_RSI->loadedFinalSchema).ptr.isSet == true) {
    pMVar3 = &in_RSI->loadedFinalSchema;
    pIVar2 = in_RSI->module->compiler;
LAB_0015521d:
    aVar4.value = SchemaLoader::loadOnce
                            (&(pIVar2->workspace).bootstrapLoader,&(pMVar3->ptr).field_1.value);
    *(undefined1 *)&(this->super_Resolver)._vptr_Resolver = 1;
    aVar6 = extraout_RDX;
LAB_00155225:
    this->module = (CompiledModule *)aVar4;
  }
  else {
    MVar5 = getContent(in_RSI,BOOTSTRAP);
    aVar6 = extraout_RDX_00;
    if (MVar5.ptr != (Content *)0x0) {
      bVar1 = ((MVar5.ptr)->bootstrapSchema).ptr.isSet;
      if (((MVar5.ptr)->state != FINISHED) || ((bVar1 & 1U) != 0)) {
        *(bool *)&(this->super_Resolver)._vptr_Resolver = bVar1;
        if ((bVar1 & 1U) == 0) goto LAB_00155280;
        aVar4 = ((MVar5.ptr)->bootstrapSchema).ptr.field_1;
        goto LAB_00155225;
      }
      if (((MVar5.ptr)->finalSchema).ptr.isSet == true) {
        pMVar3 = &(MVar5.ptr)->finalSchema;
        pIVar2 = in_RSI->module->compiler;
        goto LAB_0015521d;
      }
    }
    *(undefined1 *)&(this->super_Resolver)._vptr_Resolver = 0;
  }
LAB_00155280:
  MVar7.ptr.field_1 = aVar6;
  MVar7.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar7.ptr;
}

Assistant:

kj::Maybe<Schema> Compiler::Node::getBootstrapSchema() {
  KJ_IF_MAYBE(schema, loadedFinalSchema) {
    // We don't need to rebuild the bootstrap schema if we already have a final schema.
    return module->getCompiler().getWorkspace().bootstrapLoader.loadOnce(*schema);
  } else KJ_IF_MAYBE(content, getContent(Content::BOOTSTRAP)) {
    if (content->state == Content::FINISHED && content->bootstrapSchema == nullptr) {
      // The bootstrap schema was discarded.  Copy it from the final schema.
      // (We can't just return the final schema because using it could trigger schema loader
      // callbacks that would deadlock.)
      KJ_IF_MAYBE(finalSchema, content->finalSchema) {
        return module->getCompiler().getWorkspace().bootstrapLoader.loadOnce(*finalSchema);
      } else {
        return nullptr;
      }
    } else {
      return content->bootstrapSchema;
    }
  } else {
    return nullptr;
  }
}